

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O1

void on_handshake_complete(h2o_socket_t *sock,char *err)

{
  ptls_t *tls;
  h2o_socket_cb UNRECOVERED_JUMPTABLE;
  st_h2o_socket_ssl_t *psVar1;
  h2o_iovec_t value;
  int iVar2;
  size_t sVar3;
  SSL_CIPHER *c;
  ulong uVar4;
  SSL_SESSION *pSVar5;
  uint uVar6;
  st_h2o_evloop_socket_t *sock_1;
  
  if (err == (char *)0x0) {
    tls = sock->ssl->ptls;
    if (tls == (ptls_t *)0x0) {
      c = SSL_get_current_cipher((SSL *)sock->ssl->ossl);
      uVar4 = SSL_CIPHER_get_id(c);
      sVar3 = 0x1d;
      if ((3 < (int)uVar4 + 0xfcffff64U) &&
         ((uVar6 = (int)uVar4 + 0xfcff3fd5, 5 < uVar6 || ((0x33U >> (uVar6 & 0x1f) & 1) == 0)))) {
        sVar3 = 0x20;
      }
    }
    else {
      sVar3 = ptls_get_record_overhead(tls);
    }
    sock->ssl->record_overhead = sVar3;
  }
  if (sock->ssl->ossl != (SSL *)0x0) {
    iVar2 = SSL_is_server();
    if (((iVar2 == 0) && ((sock->ssl->handshake).field_1.client.session_cache != (h2o_cache_t *)0x0)
        ) && ((err == (char *)0x0 || (h2o_socket_error_ssl_cert_name_mismatch == err)))) {
      pSVar5 = SSL_get1_session((SSL *)sock->ssl->ossl);
      psVar1 = sock->ssl;
      value.len = 1;
      value.base = (char *)pSVar5;
      h2o_cache_set((psVar1->handshake).field_1.client.session_cache,(sock[1].ssl)->record_overhead,
                    (psVar1->handshake).field_1.client.session_cache_key,
                    (psVar1->handshake).field_1.client.session_cache_key_hash,value);
    }
  }
  UNRECOVERED_JUMPTABLE = (sock->ssl->handshake).cb;
  (sock->_cb).write = (h2o_socket_cb)0x0;
  (sock->ssl->handshake).cb = (h2o_socket_cb)0x0;
  if (err == (char *)0x0) {
    decode_ssl_input(sock);
  }
  (*UNRECOVERED_JUMPTABLE)(sock,err);
  return;
}

Assistant:

static void on_handshake_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;

    h2o_timeout_unlink(&client->_timeout);

    if (err == NULL) {
        /* success */
    } else if (err == h2o_socket_error_ssl_cert_name_mismatch &&
               (SSL_CTX_get_verify_mode(client->super.ctx->ssl_ctx) & SSL_VERIFY_PEER) == 0) {
        /* peer verification skipped */
    } else {
        on_connect_error(client, err);
        return;
    }

    on_connection_ready(client);
}